

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void cs::foreach_helper<cs::range_type,cs::numeric>
               (context_t *context,string *iterator,var *obj,
               deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RCX;
  exception *e;
  exception *e_1;
  statement_base **ptr;
  iterator __end3;
  iterator __begin3;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range3;
  numeric *it;
  range_iterator __end0;
  range_iterator __begin0;
  range_type *__range2;
  scope_guard scope;
  range_iterator *in_stack_fffffffffffffdd8;
  process_context *in_stack_fffffffffffffde0;
  numeric *in_stack_fffffffffffffde8;
  any *in_stack_fffffffffffffdf0;
  range_iterator *in_stack_fffffffffffffe00;
  range_type *in_stack_fffffffffffffe38;
  any *in_stack_fffffffffffffe60;
  var *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  domain_manager *in_stack_fffffffffffffed0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_128;
  undefined8 local_108;
  undefined1 local_f8 [40];
  undefined1 *local_d0;
  range_type *local_30;
  undefined8 local_20;
  
  local_20 = in_RCX;
  cs_impl::any::const_val<cs::range_type>(in_stack_fffffffffffffe60);
  bVar1 = range_type::empty((range_type *)0x5e6e1c);
  if (!bVar1) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e6e34);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e6e40);
    if ((peVar2->break_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e6e56);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e6e62);
      peVar2->break_block = false;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5e6e76);
    peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x5e6e82);
    if ((peVar2->continue_block & 1U) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e6e98);
      peVar2 = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e6ea4);
      peVar2->continue_block = false;
    }
    scope_guard::scope_guard
              ((scope_guard *)in_stack_fffffffffffffde0,(context_t *)in_stack_fffffffffffffdd8);
    local_30 = cs_impl::any::const_val<cs::range_type>(in_stack_fffffffffffffe60);
    range_type::begin(in_stack_fffffffffffffe38);
    range_type::end(in_stack_fffffffffffffe38);
    while (bVar1 = range_iterator::operator!=
                             ((range_iterator *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
          , bVar1) {
      range_iterator::operator*(in_stack_fffffffffffffdd8);
      local_d0 = local_f8;
      process_context::poll_event(in_stack_fffffffffffffde0);
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x5e6f7e);
      std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x5e6f8a);
      cs_impl::any::any<cs::numeric>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      domain_manager::add_var_no_return<std::__cxx11::string_const&>
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      cs_impl::any::~any((any *)0x5e6fdd);
      local_108 = local_20;
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffdd8);
      std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
                ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                 in_stack_fffffffffffffdd8);
      while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffde0,
                                     (_Self *)in_stack_fffffffffffffdd8), bVar1) {
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator*(&local_128);
        statement_base::run((statement_base *)in_stack_fffffffffffffde0);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e731c);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e7328);
        if ((peVar2->return_fcall & 1U) != 0) goto LAB_005e7412;
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e734b);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e7357);
        if ((peVar2->break_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e736d);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e7379);
          peVar2->break_block = false;
          goto LAB_005e7412;
        }
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x5e739a);
        peVar2 = std::
                 __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x5e73a6);
        if ((peVar2->continue_block & 1U) != 0) {
          std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x5e73bc);
          peVar2 = std::
                   __shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x5e73c8);
          peVar2->continue_block = false;
          break;
        }
        std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
        operator++((_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>
                    *)in_stack_fffffffffffffde0);
      }
      scope_guard::clear((scope_guard *)0x5e73f2);
      range_iterator::operator++(in_stack_fffffffffffffe00);
    }
LAB_005e7412:
    scope_guard::~scope_guard((scope_guard *)0x5e741f);
  }
  return;
}

Assistant:

void foreach_helper(const context_t &context, const string &iterator, const var &obj,
	                    std::deque<statement_base *> &body)
	{
		if (obj.const_val<T>().empty())
			return;
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		for (const X &it: obj.const_val<T>()) {
			current_process->poll_event();
			context->instance->storage.add_var_no_return(iterator, it);
			for (auto &ptr: body) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}